

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shift.c
# Opt level: O0

rt_function_error_t allocate_shift_local_context(rt_function_t *f)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  rt_variable_getter p_Var6;
  rt_variable_setter p_Var7;
  void *pvVar8;
  rt_list_t src;
  rt_list_t shape;
  rt_list_t shape_00;
  rt_list_t rVar9;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_88;
  int j_1;
  int a;
  int j;
  int shift;
  int shift_index;
  int size;
  int stride;
  int i;
  undefined4 uStack_54;
  undefined4 uStack_44;
  undefined4 uStack_34;
  shift_local_context_t *context;
  shift_private_t *p;
  rt_function_t *f_local;
  
  if (f->num_of_inputs == 1) {
    if (f->num_of_outputs == 1) {
      piVar5 = (int *)(*rt_malloc_func)(0x70);
      if (piVar5 == (int *)0x0) {
        f_local._4_4_ = RT_FUNCTION_ERROR_MALLOC;
      }
      else {
        pvVar2 = f->local_context;
        *(int **)f->local_context = piVar5;
        rVar9._4_4_ = 0;
        rVar9.size = ((*f->inputs)->shape).size;
        rVar9.data = ((*f->inputs)->shape).data;
        rVar9 = clone_list(rVar9);
        *(ulong *)piVar5 = CONCAT44(uStack_34,rVar9.size);
        *(int **)(piVar5 + 2) = rVar9.data;
        src._4_4_ = 0;
        src.size = ((*f->outputs)->shape).size;
        src.data = ((*f->outputs)->shape).data;
        rVar9 = clone_list(src);
        *(ulong *)(piVar5 + 4) = CONCAT44(uStack_44,rVar9.size);
        *(int **)(piVar5 + 6) = rVar9.data;
        shape._4_4_ = 0;
        shape.size = ((*f->inputs)->shape).size;
        shape.data = ((*f->inputs)->shape).data;
        rVar9 = calc_contiguous_strides(shape);
        *(ulong *)(piVar5 + 8) = CONCAT44(uStack_54,rVar9.size);
        *(int **)(piVar5 + 10) = rVar9.data;
        rVar9 = allocate_list(piVar5[4]);
        *(ulong *)(piVar5 + 0xc) = CONCAT44(i,rVar9.size);
        *(int **)(piVar5 + 0xe) = rVar9.data;
        *(rt_variable_t **)(piVar5 + 0x12) = *f->inputs;
        p_Var6 = select_getter(*(rt_variable_t **)(piVar5 + 0x12));
        *(rt_variable_getter *)(piVar5 + 0x14) = p_Var6;
        *(rt_variable_t **)(piVar5 + 0x16) = *f->outputs;
        p_Var7 = select_setter(*(rt_variable_t **)(piVar5 + 0x16));
        *(rt_variable_setter *)(piVar5 + 0x18) = p_Var7;
        shape_00._4_4_ = 0;
        shape_00.size = **(uint **)(piVar5 + 0x16);
        shape_00.data = *(int **)(*(uint **)(piVar5 + 0x16) + 2);
        iVar3 = calc_shape_size(shape_00);
        piVar5[0x1a] = iVar3;
        pvVar8 = (*rt_malloc_func)((long)*piVar5 << 3);
        *(void **)(piVar5 + 0x10) = pvVar8;
        for (size = 0; size < *piVar5; size = size + 1) {
          iVar3 = *(int *)(*(long *)(piVar5 + 10) + (long)size * 4);
          iVar1 = *(int *)(*(long *)(piVar5 + 2) + (long)size * 4);
          pvVar8 = (*rt_malloc_func)((long)iVar1 << 2);
          *(void **)(*(long *)(piVar5 + 0x10) + (long)size * 8) = pvVar8;
          iVar4 = (*(int *)((long)pvVar2 + 8) - *piVar5) + size;
          if (iVar4 < 0) {
            local_ac = 0;
          }
          else {
            local_ac = -*(int *)(*(long *)((long)pvVar2 + 0x10) + (long)iVar4 * 4);
          }
          if (*(int *)((long)pvVar2 + 0x18) == 1) {
            for (j_1 = 0; j_1 < iVar1; j_1 = j_1 + 1) {
              if (iVar1 < 2) {
                local_b0 = 0;
              }
              else {
                local_b0 = j_1 + iVar1 * 2 + local_ac;
                if (local_b0 < 1) {
                  local_b0 = -local_b0;
                }
                local_b0 = local_b0 % (iVar1 << 1);
              }
              if (local_b0 < iVar1) {
                local_b4 = local_b0;
              }
              else {
                local_b4 = (iVar1 * 2 + -1) - local_b0;
              }
              *(int *)(*(long *)(*(long *)(piVar5 + 0x10) + (long)size * 8) + (long)j_1 * 4) =
                   local_b4 * iVar3;
            }
          }
          else {
            for (local_88 = 0; local_88 < iVar1; local_88 = local_88 + 1) {
              if (local_88 + local_ac < 1) {
                local_b8 = 0;
              }
              else {
                local_b8 = local_88 + local_ac;
              }
              if (local_b8 < iVar1 + -1) {
                if (local_88 + local_ac < 1) {
                  local_bc = 0;
                }
                else {
                  local_bc = local_88 + local_ac;
                }
                local_c0 = local_bc;
              }
              else {
                local_c0 = iVar1 + -1;
              }
              *(int *)(*(long *)(*(long *)(piVar5 + 0x10) + (long)size * 8) + (long)local_88 * 4) =
                   local_c0 * iVar3;
            }
          }
        }
        if (((*(byte *)(*(long *)(piVar5 + 0x12) + 0x10) & 0xf) == 0) &&
           ((*(byte *)(*(long *)(piVar5 + 0x16) + 0x10) & 0xf) == 0)) {
          f->exec_func = exec_shift;
        }
        else {
          f->exec_func = exec_shift_generic;
        }
        f_local._4_4_ = RT_FUNCTION_ERROR_NOERROR;
      }
    }
    else {
      f_local._4_4_ = RT_FUNCTION_ERROR_INVALID_NUM_OF_OUTPUTS;
    }
  }
  else {
    f_local._4_4_ = RT_FUNCTION_ERROR_INVALID_NUM_OF_INPUTS;
  }
  return f_local._4_4_;
}

Assistant:

rt_function_error_t allocate_shift_local_context(rt_function_t *f) {
  if (f->num_of_inputs != 1) {
    return RT_FUNCTION_ERROR_INVALID_NUM_OF_INPUTS;
  }
  if (f->num_of_outputs != 1) {
    return RT_FUNCTION_ERROR_INVALID_NUM_OF_OUTPUTS;
  }

  shift_private_t *p = rt_malloc_func(sizeof(shift_private_t));
  if (p == 0) {
    return RT_FUNCTION_ERROR_MALLOC;
  }
  shift_local_context_t *context = (shift_local_context_t *)(f->local_context);
  ((shift_local_context_t *)(f->local_context))->data = (void *)p;
  p->input_shape = clone_list(f->inputs[0]->shape);
  p->output_shape = clone_list(f->outputs[0]->shape);
  p->input_strides = calc_contiguous_strides(f->inputs[0]->shape);
  p->out_position = allocate_list(p->output_shape.size);
  p->input = f->inputs[0];
  p->get_input = select_getter(p->input);
  p->output = f->outputs[0];
  p->set_output = select_setter(p->output);
  p->output_size = calc_shape_size(p->output->shape);

  p->table = rt_malloc_func(sizeof(int *) * p->input_shape.size);

  for (int i = 0; i < p->input_shape.size; i++) {
    const int stride = p->input_strides.data[i];
    const int size = p->input_shape.data[i];
    p->table[i] = rt_malloc_func(size * sizeof(int));
    const int shift_index = context->shifts.size - p->input_shape.size + i;
    const int shift = shift_index >= 0 ? -context->shifts.data[shift_index] : 0;

    if (context->border_mode == SHIFT_BORDER_MODE_REFLECT) {
      for (int j = 0; j < size; j++) {
        const int a = size > 1 ? (abs(j + size * 2 + shift) % (size * 2)) : 0;
        p->table[i][j] = (a >= size ? (size * 2) - 1 - a : a) * stride;
      }
    } else {
      for (int j = 0; j < size; j++) {
        p->table[i][j] = MIN(MAX(j + shift, 0), size - 1) * stride;
      }
    }
  }
  if (p->input->type == NN_DATA_TYPE_FLOAT &&
      p->output->type == NN_DATA_TYPE_FLOAT) {
#ifdef CONFIG_SHIFT_FLOAT32
    f->exec_func = exec_shift;
#endif /* CONFIG_SHIFT_FLOAT32 */
  } else {
#ifdef CONFIG_SHIFT_GENERIC
    f->exec_func = exec_shift_generic;
#endif /* CONFIG_SHIFT_GENERIC */
  }
  return RT_FUNCTION_ERROR_NOERROR;
}